

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jfdctint.c
# Opt level: O3

void jpeg_fdct_7x7(DCTELEM *data,JSAMPARRAY sample_data,JDIMENSION start_col)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  byte bVar6;
  ulong uVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  ulong uVar12;
  long lVar13;
  uint uVar14;
  long lVar16;
  long lVar17;
  ulong uVar18;
  long lVar19;
  long lVar20;
  long lVar21;
  long lVar22;
  ulong uVar15;
  
  lVar22 = 0;
  memset(data,0,0x100);
  uVar7 = (ulong)start_col;
  do {
    lVar8 = *(long *)((long)sample_data + lVar22);
    bVar1 = *(byte *)(lVar8 + 6 + uVar7);
    uVar12 = (ulong)((uint)*(byte *)(lVar8 + uVar7) + (uint)bVar1);
    bVar2 = *(byte *)(lVar8 + 1 + uVar7);
    bVar3 = *(byte *)(lVar8 + 5 + uVar7);
    uVar14 = (uint)bVar2 + (uint)bVar3;
    uVar15 = (ulong)uVar14;
    bVar4 = *(byte *)(lVar8 + 2 + uVar7);
    bVar5 = *(byte *)(lVar8 + 4 + uVar7);
    uVar18 = (ulong)((uint)bVar4 + (uint)bVar5);
    bVar6 = *(byte *)(lVar8 + 3 + uVar7);
    lVar11 = (ulong)*(byte *)(lVar8 + uVar7) - (ulong)bVar1;
    lVar10 = (ulong)bVar2 - (ulong)bVar3;
    lVar9 = (ulong)bVar4 - (ulong)bVar5;
    data[lVar22] = (uVar14 + bVar6 + (int)(uVar18 + uVar12)) * 4 + -0xe00;
    lVar16 = (uVar18 + uVar12 + (ulong)bVar6 * -4) * 0xb50;
    lVar8 = (uVar15 - uVar18) * 0xa12;
    data[lVar22 + 2] = (DCTELEM)(lVar8 + (uVar12 - uVar18) * 0x1d76 + lVar16 + 0x400 >> 0xb);
    lVar13 = (uVar12 - uVar15) * 0x1c37;
    data[lVar22 + 4] =
         (DCTELEM)(lVar8 + lVar13 + 0x400 + (uVar15 - ((uint)bVar6 + (uint)bVar6)) * 0x7ffffffe95f
                  >> 0xb);
    data[lVar22 + 6] = (DCTELEM)(lVar13 + 0x400 + (uVar12 - uVar18) * -0x1d76 + lVar16 >> 0xb);
    lVar8 = (lVar10 + lVar11) * 0x1def;
    lVar16 = (lVar9 + lVar11) * 0x13a3;
    data[lVar22 + 1] =
         (DCTELEM)((ulong)(lVar16 + 0x400 + (lVar11 - lVar10) * -0x573 + lVar8) >> 0xb);
    lVar13 = (lVar10 + lVar9) * -0x2c1f;
    data[lVar22 + 3] = (DCTELEM)((ulong)(lVar8 + 0x400 + (lVar11 - lVar10) * 0x573 + lVar13) >> 0xb)
    ;
    data[lVar22 + 5] = (DCTELEM)((ulong)(lVar9 * 0x3bde + lVar16 + 0x400 + lVar13) >> 0xb);
    lVar22 = lVar22 + 8;
  } while (lVar22 != 0x38);
  lVar22 = 0;
  do {
    lVar11 = (long)(data[lVar22 + 0x30] + data[lVar22]);
    lVar10 = (long)(data[lVar22 + 0x28] + data[lVar22 + 8]);
    lVar20 = (long)(data[lVar22 + 0x20] + data[lVar22 + 0x10]);
    lVar19 = (long)data[lVar22 + 0x18];
    lVar8 = (long)(data[lVar22] - data[lVar22 + 0x30]);
    lVar9 = (long)(data[lVar22 + 8] - data[lVar22 + 0x28]);
    lVar13 = (long)(data[lVar22 + 0x10] - data[lVar22 + 0x20]);
    data[lVar22] = (DCTELEM)((lVar10 + lVar19 + lVar20 + lVar11) * 0x29cc + 0x4000U >> 0xf);
    lVar17 = (lVar20 + lVar11 + lVar19 * -4) * 0xec7;
    lVar21 = (lVar10 - lVar20) * 0xd27;
    data[lVar22 + 0x10] = (DCTELEM)(lVar21 + (lVar11 - lVar20) * 0x267a + lVar17 + 0x4000U >> 0xf);
    lVar16 = (lVar11 - lVar10) * 0x24da;
    data[lVar22 + 0x20] =
         (DCTELEM)((ulong)(lVar21 + lVar16 + 0x4000 + (lVar10 + lVar19 * -2) * 0x7fffffffe272) >>
                  0xf);
    data[lVar22 + 0x30] =
         (DCTELEM)((ulong)(lVar16 + 0x4000 + (lVar11 - lVar20) * -0x267a + lVar17) >> 0xf);
    lVar11 = (lVar9 + lVar8) * 0x2719;
    lVar10 = (lVar9 + lVar13) * -0x39a0;
    lVar16 = (lVar13 + lVar8) * 0x19a5;
    data[lVar22 + 8] =
         (DCTELEM)((ulong)(lVar16 + 0x4000 + (lVar8 - lVar9) * -0x71e + lVar11) >> 0xf);
    data[lVar22 + 0x18] =
         (DCTELEM)((ulong)(lVar11 + 0x4000 + (lVar8 - lVar9) * 0x71e + lVar10) >> 0xf);
    data[lVar22 + 0x28] = (DCTELEM)((ulong)(lVar16 + lVar13 * 0x4e31 + 0x4000 + lVar10) >> 0xf);
    lVar22 = lVar22 + 1;
  } while ((int)lVar22 != 7);
  return;
}

Assistant:

GLOBAL(void)
jpeg_fdct_7x7 (DCTELEM * data, JSAMPARRAY sample_data, JDIMENSION start_col)
{
  INT32 tmp0, tmp1, tmp2, tmp3;
  INT32 tmp10, tmp11, tmp12;
  INT32 z1, z2, z3;
  DCTELEM *dataptr;
  JSAMPROW elemptr;
  int ctr;
  SHIFT_TEMPS

  /* Pre-zero output coefficient block. */
  MEMZERO(data, SIZEOF(DCTELEM) * DCTSIZE2);

  /* Pass 1: process rows. */
  /* Note results are scaled up by sqrt(8) compared to a true DCT; */
  /* furthermore, we scale the results by 2**PASS1_BITS. */
  /* cK represents sqrt(2) * cos(K*pi/14). */

  dataptr = data;
  for (ctr = 0; ctr < 7; ctr++) {
    elemptr = sample_data[ctr] + start_col;

    /* Even part */

    tmp0 = GETJSAMPLE(elemptr[0]) + GETJSAMPLE(elemptr[6]);
    tmp1 = GETJSAMPLE(elemptr[1]) + GETJSAMPLE(elemptr[5]);
    tmp2 = GETJSAMPLE(elemptr[2]) + GETJSAMPLE(elemptr[4]);
    tmp3 = GETJSAMPLE(elemptr[3]);

    tmp10 = GETJSAMPLE(elemptr[0]) - GETJSAMPLE(elemptr[6]);
    tmp11 = GETJSAMPLE(elemptr[1]) - GETJSAMPLE(elemptr[5]);
    tmp12 = GETJSAMPLE(elemptr[2]) - GETJSAMPLE(elemptr[4]);

    z1 = tmp0 + tmp2;
    /* Apply unsigned->signed conversion */
    dataptr[0] = (DCTELEM)
      ((z1 + tmp1 + tmp3 - 7 * CENTERJSAMPLE) << PASS1_BITS);
    tmp3 += tmp3;
    z1 -= tmp3;
    z1 -= tmp3;
    z1 = MULTIPLY(z1, FIX(0.353553391));                /* (c2+c6-c4)/2 */
    z2 = MULTIPLY(tmp0 - tmp2, FIX(0.920609002));       /* (c2+c4-c6)/2 */
    z3 = MULTIPLY(tmp1 - tmp2, FIX(0.314692123));       /* c6 */
    dataptr[2] = (DCTELEM) DESCALE(z1 + z2 + z3, CONST_BITS-PASS1_BITS);
    z1 -= z2;
    z2 = MULTIPLY(tmp0 - tmp1, FIX(0.881747734));       /* c4 */
    dataptr[4] = (DCTELEM)
      DESCALE(z2 + z3 - MULTIPLY(tmp1 - tmp3, FIX(0.707106781)), /* c2+c6-c4 */
	      CONST_BITS-PASS1_BITS);
    dataptr[6] = (DCTELEM) DESCALE(z1 + z2, CONST_BITS-PASS1_BITS);

    /* Odd part */

    tmp1 = MULTIPLY(tmp10 + tmp11, FIX(0.935414347));   /* (c3+c1-c5)/2 */
    tmp2 = MULTIPLY(tmp10 - tmp11, FIX(0.170262339));   /* (c3+c5-c1)/2 */
    tmp0 = tmp1 - tmp2;
    tmp1 += tmp2;
    tmp2 = MULTIPLY(tmp11 + tmp12, - FIX(1.378756276)); /* -c1 */
    tmp1 += tmp2;
    tmp3 = MULTIPLY(tmp10 + tmp12, FIX(0.613604268));   /* c5 */
    tmp0 += tmp3;
    tmp2 += tmp3 + MULTIPLY(tmp12, FIX(1.870828693));   /* c3+c1-c5 */

    dataptr[1] = (DCTELEM) DESCALE(tmp0, CONST_BITS-PASS1_BITS);
    dataptr[3] = (DCTELEM) DESCALE(tmp1, CONST_BITS-PASS1_BITS);
    dataptr[5] = (DCTELEM) DESCALE(tmp2, CONST_BITS-PASS1_BITS);

    dataptr += DCTSIZE;		/* advance pointer to next row */
  }

  /* Pass 2: process columns.
   * We remove the PASS1_BITS scaling, but leave the results scaled up
   * by an overall factor of 8.
   * We must also scale the output by (8/7)**2 = 64/49, which we fold
   * into the constant multipliers:
   * cK now represents sqrt(2) * cos(K*pi/14) * 64/49.
   */

  dataptr = data;
  for (ctr = 0; ctr < 7; ctr++) {
    /* Even part */

    tmp0 = dataptr[DCTSIZE*0] + dataptr[DCTSIZE*6];
    tmp1 = dataptr[DCTSIZE*1] + dataptr[DCTSIZE*5];
    tmp2 = dataptr[DCTSIZE*2] + dataptr[DCTSIZE*4];
    tmp3 = dataptr[DCTSIZE*3];

    tmp10 = dataptr[DCTSIZE*0] - dataptr[DCTSIZE*6];
    tmp11 = dataptr[DCTSIZE*1] - dataptr[DCTSIZE*5];
    tmp12 = dataptr[DCTSIZE*2] - dataptr[DCTSIZE*4];

    z1 = tmp0 + tmp2;
    dataptr[DCTSIZE*0] = (DCTELEM)
      DESCALE(MULTIPLY(z1 + tmp1 + tmp3, FIX(1.306122449)), /* 64/49 */
	      CONST_BITS+PASS1_BITS);
    tmp3 += tmp3;
    z1 -= tmp3;
    z1 -= tmp3;
    z1 = MULTIPLY(z1, FIX(0.461784020));                /* (c2+c6-c4)/2 */
    z2 = MULTIPLY(tmp0 - tmp2, FIX(1.202428084));       /* (c2+c4-c6)/2 */
    z3 = MULTIPLY(tmp1 - tmp2, FIX(0.411026446));       /* c6 */
    dataptr[DCTSIZE*2] = (DCTELEM) DESCALE(z1 + z2 + z3, CONST_BITS+PASS1_BITS);
    z1 -= z2;
    z2 = MULTIPLY(tmp0 - tmp1, FIX(1.151670509));       /* c4 */
    dataptr[DCTSIZE*4] = (DCTELEM)
      DESCALE(z2 + z3 - MULTIPLY(tmp1 - tmp3, FIX(0.923568041)), /* c2+c6-c4 */
	      CONST_BITS+PASS1_BITS);
    dataptr[DCTSIZE*6] = (DCTELEM) DESCALE(z1 + z2, CONST_BITS+PASS1_BITS);

    /* Odd part */

    tmp1 = MULTIPLY(tmp10 + tmp11, FIX(1.221765677));   /* (c3+c1-c5)/2 */
    tmp2 = MULTIPLY(tmp10 - tmp11, FIX(0.222383464));   /* (c3+c5-c1)/2 */
    tmp0 = tmp1 - tmp2;
    tmp1 += tmp2;
    tmp2 = MULTIPLY(tmp11 + tmp12, - FIX(1.800824523)); /* -c1 */
    tmp1 += tmp2;
    tmp3 = MULTIPLY(tmp10 + tmp12, FIX(0.801442310));   /* c5 */
    tmp0 += tmp3;
    tmp2 += tmp3 + MULTIPLY(tmp12, FIX(2.443531355));   /* c3+c1-c5 */

    dataptr[DCTSIZE*1] = (DCTELEM) DESCALE(tmp0, CONST_BITS+PASS1_BITS);
    dataptr[DCTSIZE*3] = (DCTELEM) DESCALE(tmp1, CONST_BITS+PASS1_BITS);
    dataptr[DCTSIZE*5] = (DCTELEM) DESCALE(tmp2, CONST_BITS+PASS1_BITS);

    dataptr++;			/* advance pointer to next column */
  }
}